

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O0

TRef fold_simplify_intmod_k(jit_State *J)

{
  uint uVar1;
  TRef TVar2;
  long in_RDI;
  int32_t k;
  jit_State *unaff_retaddr;
  int32_t in_stack_fffffffffffffffc;
  
  uVar1 = *(uint *)(in_RDI + 0xa8);
  if (((int)uVar1 < 1) || ((uVar1 & uVar1 - 1) != 0)) {
    TVar2 = 0;
  }
  else {
    *(undefined1 *)(in_RDI + 0x9d) = 0x20;
    TVar2 = lj_ir_kint(unaff_retaddr,in_stack_fffffffffffffffc);
    *(short *)(in_RDI + 0x9a) = (short)TVar2;
    TVar2 = 1;
  }
  return TVar2;
}

Assistant:

LJFOLD(MOD any KINT)
LJFOLDF(simplify_intmod_k)
{
  int32_t k = fright->i;
  lua_assert(k != 0);
  if (k > 0 && (k & (k-1)) == 0) {  /* i % (2^k) ==> i & (2^k-1) */
    fins->o = IR_BAND;
    fins->op2 = lj_ir_kint(J, k-1);
    return RETRYFOLD;
  }
  return NEXTFOLD;
}